

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O2

bool __thiscall AGSSock::Pool::operator_cast_to_bool(Pool *this)

{
  bool bVar1;
  __node_base *p_Var2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->guard_);
  if (((this->sockets_)._M_h._M_element_count == 0) ||
     (bVar1 = AGSSockAPI::Thread::active(&this->thread_), bVar1)) {
    p_Var2 = &(this->sockets_)._M_h._M_before_begin;
    do {
      p_Var2 = p_Var2->_M_nxt;
      bVar1 = p_Var2 == (__node_base *)0x0;
      if (bVar1) break;
    } while (*(int *)&(p_Var2[1]._M_nxt)->_M_nxt != -1);
  }
  else {
    bVar1 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->guard_);
  return bVar1;
}

Assistant:

Pool::operator bool()
{
	Mutex::Lock lock(guard_);

	if ((sockets_.size() > 0) && !thread_.active())
		return false;

	for (Socket *sock : sockets_)
		if (sock->id == INVALID_SOCKET)
			return false;

	return true;
}